

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O2

_Bool is_intersection_correct(roaring_bitmap_t *bitmap1,roaring_bitmap_t *bitmap2)

{
  _Bool _Var1;
  roaring_bitmap_t *r;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint32_t *ans;
  uint32_t *ans_00;
  uint32_t *ans_01;
  uint32_t *out;
  size_t n_args;
  roaring_bitmap_t *r_00;
  
  r = roaring_bitmap_and(bitmap1,bitmap2);
  uVar2 = roaring_bitmap_get_cardinality(r);
  uVar3 = roaring_bitmap_and_cardinality(bitmap1,bitmap2);
  if (uVar2 == uVar3) {
    uVar2 = roaring_bitmap_get_cardinality(bitmap1);
    uVar3 = roaring_bitmap_get_cardinality(bitmap2);
    uVar4 = roaring_bitmap_get_cardinality(r);
    ans = (uint32_t *)malloc(uVar2 * 4);
    ans_00 = (uint32_t *)malloc(uVar3 * 4);
    ans_01 = (uint32_t *)malloc(uVar4 * 4);
    if ((ans_00 != (uint32_t *)0x0 && ans != (uint32_t *)0x0) && ans_01 != (uint32_t *)0x0) {
      roaring_bitmap_to_uint32_array(bitmap1,ans);
      roaring_bitmap_to_uint32_array(bitmap2,ans_00);
      roaring_bitmap_to_uint32_array(r,ans_01);
      out = (uint32_t *)malloc((uVar3 + uVar2) * 4);
      n_args = intersection_uint32(ans,uVar2,ans_00,uVar3,out);
      _Var1 = array_equals(ans_01,(int32_t)uVar4,out,(int32_t)n_args);
      if (!_Var1) {
        puts("\n\nbitmap1:");
        roaring_bitmap_printf_describe(bitmap1);
        puts("\n\nbitmap2:");
        roaring_bitmap_printf_describe(bitmap2);
        puts("\n\nresult:");
        roaring_bitmap_printf_describe(r);
        r_00 = roaring_bitmap_of_ptr(n_args,out);
        puts("\n\ncorrect result:");
        roaring_bitmap_printf_describe(r_00);
        free(r_00);
      }
      free(out);
      free(ans);
      free(ans_00);
      free(ans_01);
      roaring_bitmap_free(r);
      return _Var1;
    }
    free(ans);
    free(ans_00);
    free(ans_01);
  }
  else {
    puts("bad intersection cardinality");
  }
  return false;
}

Assistant:

bool is_intersection_correct(roaring_bitmap_t *bitmap1,
                             roaring_bitmap_t *bitmap2) {
    roaring_bitmap_t *temp = roaring_bitmap_and(bitmap1, bitmap2);
    if (roaring_bitmap_get_cardinality(temp) !=
        roaring_bitmap_and_cardinality(bitmap1, bitmap2)) {
        printf("bad intersection cardinality\n");
        return false;
    }

    uint64_t card1, card2, card;
    card1 = roaring_bitmap_get_cardinality(bitmap1);
    card2 = roaring_bitmap_get_cardinality(bitmap2);
    card = roaring_bitmap_get_cardinality(temp);
    uint32_t *arr1 = (uint32_t *)malloc(card1 * sizeof(uint32_t));
    uint32_t *arr2 = (uint32_t *)malloc(card2 * sizeof(uint32_t));
    uint32_t *arr = (uint32_t *)malloc(card * sizeof(uint32_t));

    if ((arr1 == NULL) || (arr2 == NULL) || (arr == NULL)) {
        free(arr1);
        free(arr2);
        free(arr);
        return false;
    }

    roaring_bitmap_to_uint32_array(bitmap1, arr1);
    roaring_bitmap_to_uint32_array(bitmap2, arr2);
    roaring_bitmap_to_uint32_array(temp, arr);

    uint32_t *buffer = (uint32_t *)malloc(sizeof(uint32_t) * (card1 + card2));
    size_t cardtrue = intersection_uint32(arr1, card1, arr2, card2, buffer);
    bool answer = array_equals(arr, card, buffer, cardtrue);
    if (!answer) {
        printf("\n\nbitmap1:\n");
        roaring_bitmap_printf_describe(bitmap1);  // debug
        printf("\n\nbitmap2:\n");
        roaring_bitmap_printf_describe(bitmap2);  // debug
        printf("\n\nresult:\n");
        roaring_bitmap_printf_describe(temp);  // debug
        roaring_bitmap_t *ca = roaring_bitmap_of_ptr(cardtrue, buffer);
        printf("\n\ncorrect result:\n");
        roaring_bitmap_printf_describe(ca);  // debug
        free(ca);
    }
    free(buffer);
    free(arr1);
    free(arr2);
    free(arr);
    roaring_bitmap_free(temp);
    return answer;
}